

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *bitD)

{
  size_t sVar1;
  size_t *in_RDI;
  void *in_stack_ffffffffffffffe8;
  BIT_DStream_status local_4;
  
  if (in_RDI[2] < in_RDI[4]) {
    local_4 = BIT_DStream_overflow;
  }
  else {
    in_RDI[2] = in_RDI[2] - (ulong)((uint)in_RDI[1] >> 3);
    *(uint *)(in_RDI + 1) = (uint)in_RDI[1] & 7;
    sVar1 = MEM_readLEST(in_stack_ffffffffffffffe8);
    *in_RDI = sVar1;
    local_4 = BIT_DStream_unfinished;
  }
  return local_4;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t* bitD)
{
    if (UNLIKELY(bitD->ptr < bitD->limitPtr))
        return BIT_DStream_overflow;
    assert(bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8);
    bitD->ptr -= bitD->bitsConsumed >> 3;
    bitD->bitsConsumed &= 7;
    bitD->bitContainer = MEM_readLEST(bitD->ptr);
    return BIT_DStream_unfinished;
}